

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_SUB(void)

{
  bool bVar1;
  Z80Reg ZVar2;
  ulong uVar3;
  uint local_44;
  int local_38 [2];
  int e [9];
  int reg2ex;
  Z80Reg reg2;
  Z80Reg reg;
  
  do {
    memset(local_38,0xff,0x24);
    bVar1 = CommonAluOpcode(0x90,local_38,true,true);
    if (!bVar1) {
      ZVar2 = GetRegister(&::lp);
      if (ZVar2 == Z80_UNK) {
        return;
      }
      bVar1 = comma(&::lp);
      if (!bVar1) {
        Error("[SUB] Comma expected",(char *)0x0,PASS3);
        return;
      }
      e[8] = GetRegister(&::lp);
      if (ZVar2 == Z80_HL) {
        if ((((e[8] == Z80_BC) || (e[8] == Z80_DE)) || ((e[8] == Z80_HL || (e[8] == Z80_SP)))) &&
           (bVar1 = Options::noFakes(true), !bVar1)) {
          local_38[0] = 0xb7;
          local_38[1] = 0xfffffffe;
          e[0] = 0xed;
          e[1] = e[8] + 0x32;
        }
      }
      else if (((ZVar2 == Z80_DE) &&
               ((((e[8] == Z80_BC || (e[8] == Z80_DE)) || (e[8] == Z80_HL)) || (e[8] == Z80_SP))))
              && (bVar1 = Options::noFakes(true), !bVar1)) {
        if ((e[8] == 0x20) || (e[8] == 0x30)) {
          local_44 = e[8] ^ 0x10;
        }
        else {
          local_44 = e[8];
        }
        e[7] = local_44;
        local_38[0] = 0xb7;
        local_38[1] = 0xfffffffe;
        e[0] = 0xeb;
        e[1] = -2;
        e[2] = 0xed;
        e[3] = local_44 + 0x32;
        e[4] = -2;
        e[5] = 0xeb;
      }
    }
    EmitBytes(local_38,true);
    uVar3 = (*DAT_001e16b0)(&::lp);
    if ((uVar3 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_SUB() {
		Z80Reg reg, reg2;
		int reg2ex;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1 };
			if (!CommonAluOpcode(0x90, e, true, true)) {	// handle common 8-bit variants
				reg = GetRegister(lp);	if (Z80_UNK == reg) break;
				if (!comma(lp)) {
					Error("[SUB] Comma expected");
					break;
				}
				reg2 = GetRegister(lp);
				if (Z80_HL == reg) {			// fake sub hl,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						e[0] = 0xB7;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0xed; e[3] = 0x32 + reg2;
						break;
					default: break;
					}
				} else if (Z80_DE == reg) {		// fake sub de,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						reg2ex = (Z80_DE == reg2 || Z80_HL == reg2) ? (reg2^0x10) : reg2;
						e[0] = 0xB7;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0xEB;
						e[3] = INSTRUCTION_START_MARKER; e[4] = 0xED; e[5] = 0x32 + reg2ex;
						e[6] = INSTRUCTION_START_MARKER; e[7] = 0xEB;
						break;
					default: break;
					}
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}